

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void concatFuncCore(sqlite3_context *context,int argc,sqlite3_value **argv,int nSep,char *zSep)

{
  int iVar1;
  char *z;
  void *__src;
  sqlite3_uint64 n;
  size_t __n;
  ulong uVar2;
  long lVar3;
  
  if (argc < 1) {
    lVar3 = 0;
  }
  else {
    uVar2 = 0;
    lVar3 = 0;
    do {
      iVar1 = sqlite3ValueBytes(argv[uVar2],'\x01');
      lVar3 = lVar3 + iVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  __n = (size_t)nSep;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    z = (char *)sqlite3Malloc((long)(argc + -1) * __n + lVar3 + 1);
  }
  else {
    z = (char *)0x0;
  }
  if (z == (char *)0x0) {
    sqlite3_result_error_nomem(context);
    return;
  }
  if (argc < 1) {
    n = 0;
  }
  else {
    uVar2 = 0;
    n = 0;
    do {
      iVar1 = sqlite3ValueBytes(argv[uVar2],'\x01');
      if ((0 < iVar1) && (__src = sqlite3ValueText(argv[uVar2],'\x01'), __src != (void *)0x0)) {
        if ((0 < nSep) && (0 < (long)n)) {
          memcpy(z + n,zSep,__n);
          n = n + __n;
        }
        memcpy(z + n,__src,(long)iVar1);
        n = n + (long)iVar1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  z[n] = '\0';
  sqlite3_result_text64(context,z,n,sqlite3_free,'\x01');
  return;
}

Assistant:

static void concatFuncCore(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  int nSep,
  const char *zSep
){
  i64 j, k, n = 0;
  int i;
  char *z;
  for(i=0; i<argc; i++){
    n += sqlite3_value_bytes(argv[i]);
  }
  n += (argc-1)*(i64)nSep;
  z = sqlite3_malloc64(n+1);
  if( z==0 ){
    sqlite3_result_error_nomem(context);
    return;
  }
  j = 0;
  for(i=0; i<argc; i++){
    k = sqlite3_value_bytes(argv[i]);
    if( k>0 ){
      const char *v = (const char*)sqlite3_value_text(argv[i]);
      if( v!=0 ){
        if( j>0 && nSep>0 ){
          memcpy(&z[j], zSep, nSep);
          j += nSep;
        }
        memcpy(&z[j], v, k);
        j += k;
      }
    }
  }
  z[j] = 0;
  assert( j<=n );
  sqlite3_result_text64(context, z, j, sqlite3_free, SQLITE_UTF8);
}